

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int CheckInventory(AActor *activator,char *type,bool max)

{
  bool bVar1;
  int iVar2;
  PClassActor *type_00;
  AInventory *pAVar3;
  char *format;
  
  if (type == (char *)0x0 || activator == (AActor *)0x0) {
    return 0;
  }
  iVar2 = strcasecmp(type,"Armor");
  if (iVar2 == 0) {
    type = "BasicArmor";
  }
  else {
    iVar2 = strcasecmp(type,"Health");
    if (iVar2 == 0) {
      if (!max) {
        return activator->health;
      }
      bVar1 = DObject::IsKindOf((DObject *)activator,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar1) {
        return *(int *)&activator[1].super_DThinker.super_DObject._vptr_DObject;
      }
      iVar2 = AActor::SpawnHealth(activator);
      return iVar2;
    }
  }
  type_00 = PClass::FindActor(type);
  if (type_00 == (PClassActor *)0x0) {
    format = "ACS: \'%s\': Unknown actor class.\n";
  }
  else {
    bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&type_00->super_PClass);
    if (bVar1) {
      pAVar3 = AActor::FindInventory(activator,type_00,false);
      if (!max) {
        if (pAVar3 == (AInventory *)0x0) {
          return 0;
        }
        return pAVar3->Amount;
      }
      if (pAVar3 == (AInventory *)0x0) {
        bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&type_00->super_PClass);
        if (!bVar1) {
          return 0;
        }
        pAVar3 = (AInventory *)(type_00->super_PClass).Defaults;
      }
      return pAVar3->MaxAmount;
    }
    format = "ACS: \'%s\' is not an inventory item.\n";
  }
  DPrintf(1,format,type);
  return 0;
}

Assistant:

static int CheckInventory (AActor *activator, const char *type, bool max)
{
	if (activator == NULL || type == NULL)
		return 0;

	if (stricmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	else if (stricmp (type, "Health") == 0)
	{
		if (max)
		{
			if (activator->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
				return static_cast<APlayerPawn *>(activator)->MaxHealth;
			else
				return activator->SpawnHealth();
		}
		return activator->health;
	}

	PClassActor *info = PClass::FindActor (type);

	if (info == NULL)
	{
		DPrintf (DMSG_ERROR, "ACS: '%s': Unknown actor class.\n", type);
		return 0;
	}
	else if (!info->IsDescendantOf(RUNTIME_CLASS(AInventory)))
	{
		DPrintf(DMSG_ERROR, "ACS: '%s' is not an inventory item.\n", type);
		return 0;
	}

	AInventory *item = activator->FindInventory (info);

	if (max)
	{
		if (item)
		{
			return item->MaxAmount;
		}
		else if (info != nullptr && info->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			return ((AInventory *)GetDefaultByType(info))->MaxAmount;
		}
	}
	return item ? item->Amount : 0;
}